

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_wad.cpp
# Opt level: O2

bool __thiscall FileReaderLZSS::UncompressBlock(FileReaderLZSS *this)

{
  uint *puVar1;
  BYTE **ppBVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  BYTE BVar5;
  ushort uVar6;
  ushort *puVar7;
  StreamState SVar8;
  ushort uVar9;
  byte bVar10;
  BYTE *pBVar11;
  uint uVar12;
  byte *__src;
  uint uVar13;
  
  if (((this->Stream).CFlags & 1) == 0) {
    pBVar11 = (this->Stream).In;
    (this->Stream).In = pBVar11 + 1;
    BVar5 = *pBVar11;
    pBVar11 = (this->Stream).InternalBuffer;
    (this->Stream).InternalBuffer = pBVar11 + 1;
    *pBVar11 = BVar5;
    uVar3 = (this->Stream).AvailIn;
    uVar4 = (this->Stream).InternalOut;
    (this->Stream).AvailIn = uVar3 + -1;
    (this->Stream).InternalOut = uVar4 + 1;
  }
  else {
    uVar12 = (this->Stream).AvailIn;
    if (uVar12 < 2) {
      return false;
    }
    (this->Stream).AvailIn = uVar12 - 2;
    puVar7 = (ushort *)(this->Stream).In;
    uVar6 = *puVar7;
    uVar9 = uVar6 << 8 | uVar6 >> 8;
    (this->Stream).In = (BYTE *)(puVar7 + 1);
    if ((uVar6 >> 8 & 0xf) == 0) {
      SVar8 = STREAM_FINAL;
      goto LAB_00580f87;
    }
    bVar10 = ((byte)(uVar6 >> 8) & 0xf) + 1;
    uVar6 = uVar9 >> 4;
    uVar12 = (uint)uVar6;
    pBVar11 = (this->Stream).InternalBuffer;
    __src = pBVar11 + ~(ulong)uVar12;
    if (uVar9 < 0x10) {
      memset(pBVar11,(uint)*__src,(ulong)bVar10);
    }
    else if (uVar6 < bVar10) {
      do {
        uVar13 = (uVar12 & 0xffff) + 1;
        if (bVar10 < uVar13) {
          uVar13 = (uint)bVar10;
        }
        memcpy(pBVar11,__src,(ulong)uVar13);
        pBVar11 = (this->Stream).InternalBuffer + uVar13;
        (this->Stream).InternalBuffer = pBVar11;
        puVar1 = &(this->Stream).InternalOut;
        *puVar1 = *puVar1 + uVar13;
        uVar12 = uVar13 + uVar12;
        bVar10 = bVar10 - (char)uVar13;
      } while (bVar10 != 0);
      bVar10 = 0;
    }
    else {
      memcpy(pBVar11,__src,(ulong)bVar10);
    }
    puVar1 = &(this->Stream).InternalOut;
    *puVar1 = *puVar1 + (uint)bVar10;
    ppBVar2 = &(this->Stream).InternalBuffer;
    *ppBVar2 = *ppBVar2 + bVar10;
  }
  pBVar11 = &(this->Stream).CFlags;
  *pBVar11 = *pBVar11 >> 1;
  bVar10 = (this->Stream).Bits;
  (this->Stream).Bits = bVar10 >> 1;
  if (1 < bVar10) {
    return true;
  }
  SVar8 = STREAM_FLUSH;
LAB_00580f87:
  (this->Stream).State = SVar8;
  return true;
}

Assistant:

bool UncompressBlock()
	{
		if(Stream.CFlags & 1)
		{
			// Check to see if we have enough input
			if(Stream.AvailIn < 2)
				return false;
			Stream.AvailIn -= 2;

			WORD pos = BigShort(*(WORD*)Stream.In);
			BYTE len = (pos & 0xF)+1;
			pos >>= 4;
			Stream.In += 2;
			if(len == 1)
			{
				// We've reached the end of the stream.
				Stream.State = STREAM_FINAL;
				return true;
			}

			const BYTE* copyStart = Stream.InternalBuffer-pos-1;

			// Complete overlap: Single byte repeated
			if(pos == 0)
				memset(Stream.InternalBuffer, *copyStart, len);
			// No overlap: One copy
			else if(pos >= len)
				memcpy(Stream.InternalBuffer, copyStart, len);
			else
			{
				// Partial overlap: Copy in 2 or 3 chunks.
				do
				{
					unsigned int copy = MIN<unsigned int>(len, pos+1);
					memcpy(Stream.InternalBuffer, copyStart, copy);
					Stream.InternalBuffer += copy;
					Stream.InternalOut += copy;
					len -= copy;
					pos += copy; // Increase our position since we can copy twice as much the next round.
				}
				while(len);
			}

			Stream.InternalOut += len;
			Stream.InternalBuffer += len;
		}
		else
		{
			// Uncompressed byte.
			*Stream.InternalBuffer++ = *Stream.In++;
			--Stream.AvailIn;
			++Stream.InternalOut;
		}

		Stream.CFlags >>= 1;
		Stream.Bits >>= 1;

		// If we're done with this block, flush the output
		if(Stream.Bits == 0)
			Stream.State = STREAM_FLUSH;

		return true;
	}